

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O1

void ApplyAlphaMultiply_16b_C(uint8_t *rgba4444,int w,int h,int stride)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  if (0 < h) {
    do {
      if (0 < w) {
        uVar5 = 0;
        do {
          bVar1 = rgba4444[uVar5 * 2];
          bVar2 = rgba4444[uVar5 * 2 + 1];
          uVar6 = bVar2 & 0xf;
          iVar4 = uVar6 * 0x1111;
          rgba4444[uVar5 * 2] =
               (byte)((uint)(byte)(bVar1 << 4 | bVar1 & 0xf) * iVar4 >> 0x14) |
               (byte)((uint)(byte)(bVar1 >> 4 | bVar1 & 0xf0) * iVar4 >> 0x10) & 0xf0;
          rgba4444[uVar5 * 2 + 1] =
               (byte)(((uint)(bVar2 >> 4) | bVar2 & 0xfffffff0) * iVar4 >> 0x10) & 0xf0 |
               (byte)uVar6;
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
      }
      rgba4444 = rgba4444 + stride;
      bVar3 = 1 < h;
      h = h + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

static WEBP_INLINE void ApplyAlphaMultiply4444_C(uint8_t* rgba4444,
                                                 int w, int h, int stride,
                                                 int rg_byte_pos /* 0 or 1 */) {
  while (h-- > 0) {
    int i;
    for (i = 0; i < w; ++i) {
      const uint32_t rg = rgba4444[2 * i + rg_byte_pos];
      const uint32_t ba = rgba4444[2 * i + (rg_byte_pos ^ 1)];
      const uint8_t a = ba & 0x0f;
      const uint32_t mult = MULTIPLIER(a);
      const uint8_t r = multiply(dither_hi(rg), mult);
      const uint8_t g = multiply(dither_lo(rg), mult);
      const uint8_t b = multiply(dither_hi(ba), mult);
      rgba4444[2 * i + rg_byte_pos] = (r & 0xf0) | ((g >> 4) & 0x0f);
      rgba4444[2 * i + (rg_byte_pos ^ 1)] = (b & 0xf0) | a;
    }
    rgba4444 += stride;
  }
}